

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ContextType ctxType;
  int iVar12;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLfloat expected_vector [4];
  GLfloat local_48 [6];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    prepare(this);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    bVar1 = testSamplerFloatVectorParameter(this,0x1004,local_48);
    bVar2 = testSamplerIntegerParameter(this,0x884d,0x203);
    bVar3 = testSamplerIntegerParameter(this,0x884c,0);
    bVar4 = testSamplerFloatParameter(this,0x8501,0.0);
    bVar5 = testSamplerFloatParameter(this,0x813b,1000.0);
    bVar6 = testSamplerIntegerParameter(this,0x2800,0x2601);
    bVar7 = testSamplerIntegerParameter(this,0x2801,0x2702);
    bVar8 = testSamplerFloatParameter(this,0x813a,-1000.0);
    bVar9 = testSamplerIntegerParameter(this,0x2802,0x2901);
    bVar10 = testSamplerIntegerParameter(this,0x2803,0x2901);
    bVar11 = testSamplerIntegerParameter(this,0x8072,0x2901);
    iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_sampler_dsa != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar12) + 0x468))(1);
      this->m_sampler_dsa = 0;
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar10 && bVar11) &&
        ((bVar8 && bVar9) && (((((bVar3 && bVar4) && (bVar1 && bVar2)) && bVar6) && bVar7) && bVar5)
        )) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		prepare();

		glw::GLfloat expected_vector[4] = { 0.0, 0.0, 0.0, 0.0 };

		is_ok &= testSamplerFloatVectorParameter(GL_TEXTURE_BORDER_COLOR, expected_vector);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_COMPARE_MODE, GL_NONE);
		is_ok &= testSamplerFloatParameter(GL_TEXTURE_LOD_BIAS, 0.0);
		is_ok &= testSamplerFloatParameter(GL_TEXTURE_MAX_LOD, 1000);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_LINEAR);
		is_ok &= testSamplerFloatParameter(GL_TEXTURE_MIN_LOD, -1000);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_WRAP_S, GL_REPEAT);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_WRAP_T, GL_REPEAT);
		is_ok &= testSamplerIntegerParameter(GL_TEXTURE_WRAP_R, GL_REPEAT);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}